

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

uint __thiscall
flatbuffers::Table::GetField<unsigned_int>(Table *this,voffset_t field,uint defaultval)

{
  voffset_t vVar1;
  uint local_2c;
  voffset_t field_offset;
  uint defaultval_local;
  voffset_t field_local;
  Table *this_local;
  
  vVar1 = GetOptionalFieldOffset(this,field);
  local_2c = defaultval;
  if (vVar1 != 0) {
    local_2c = ReadScalar<unsigned_int>(this + (int)(uint)vVar1);
  }
  return local_2c;
}

Assistant:

T GetField(voffset_t field, T defaultval) const {
    auto field_offset = GetOptionalFieldOffset(field);
    return field_offset ? ReadScalar<T>(data_ + field_offset) : defaultval;
  }